

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int ARKodeSStolerances(void *arkode_mem,sunrealtype reltol,sunrealtype abstol)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0xfb;
  }
  else if (*(int *)((long)arkode_mem + 0x3c0) == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar1 = -0x17;
    error_code = -0x17;
    line = 0x104;
  }
  else if (0.0 <= reltol) {
    if (0.0 <= abstol) {
      if (*(long *)(*(long *)(*(long *)((long)arkode_mem + 0x268) + 8) + 0x90) != 0) {
        *(uint *)((long)arkode_mem + 0x38) = -(uint)(abstol == 0.0) & 1;
        *(sunrealtype *)((long)arkode_mem + 0x20) = reltol;
        *(sunrealtype *)((long)arkode_mem + 0x28) = abstol;
        *(undefined4 *)((long)arkode_mem + 0x18) = 0;
        *(undefined4 *)((long)arkode_mem + 0x54) = 0;
        *(code **)((long)arkode_mem + 0x58) = arkEwtSetSS;
        *(void **)((long)arkode_mem + 0x60) = arkode_mem;
        return 0;
      }
      msgfmt = "N_VAddConst unimplemented (required for scalar abstol)";
      iVar1 = -0x16;
      error_code = -0x16;
      line = 0x118;
    }
    else {
      msgfmt = "abstol has negative component(s) (illegal).";
      iVar1 = -0x16;
      error_code = -0x16;
      line = 0x110;
    }
  }
  else {
    msgfmt = "reltol < 0 illegal.";
    iVar1 = -0x16;
    error_code = -0x16;
    line = 0x10a;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSStolerances",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int ARKodeSStolerances(void* arkode_mem, sunrealtype reltol, sunrealtype abstol)
{
  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check inputs */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }
  if (reltol < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_RELTOL);
    return (ARK_ILL_INPUT);
  }
  if (abstol < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_ABSTOL);
    return (ARK_ILL_INPUT);
  }

  /* Ensure that vector supports N_VAddConst */
  if (!ark_mem->tempv1->ops->nvaddconst)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "N_VAddConst unimplemented (required for scalar abstol)");
    return (ARK_ILL_INPUT);
  }

  /* Set flag indicating whether abstol == 0 */
  ark_mem->atolmin0 = (abstol == ZERO);

  /* Copy tolerances into memory */
  ark_mem->reltol  = reltol;
  ark_mem->Sabstol = abstol;
  ark_mem->itol    = ARK_SS;

  /* enforce use of arkEwtSetSS */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->efun      = arkEwtSetSS;
  ark_mem->e_data    = ark_mem;

  return (ARK_SUCCESS);
}